

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keymacro.c
# Opt level: O0

void node__put(EditLine *el,keymacro_node_t *ptr)

{
  wchar_t wVar1;
  keymacro_node_t *ptr_local;
  EditLine *el_local;
  
  if (ptr != (keymacro_node_t *)0x0) {
    if (ptr->next != (keymacro_node_t *)0x0) {
      node__put(el,ptr->next);
      ptr->next = (keymacro_node_t *)0x0;
    }
    node__put(el,ptr->sibling);
    wVar1 = ptr->type;
    if (wVar1 != L'\0') {
      if (wVar1 == L'\x01') {
        if ((ptr->val).str != (wchar_t *)0x0) {
          free((ptr->val).str);
        }
      }
      else if (wVar1 != L'\x02') {
        abort();
      }
    }
    free(ptr);
  }
  return;
}

Assistant:

static void
node__put(EditLine *el, keymacro_node_t *ptr)
{
	if (ptr == NULL)
		return;

	if (ptr->next != NULL) {
		node__put(el, ptr->next);
		ptr->next = NULL;
	}
	node__put(el, ptr->sibling);

	switch (ptr->type) {
	case XK_CMD:
	case XK_NOD:
		break;
	case XK_STR:
		if (ptr->val.str != NULL)
			el_free(ptr->val.str);
		break;
	default:
		EL_ABORT((el->el_errfile, "Bad XK_ type %d\n", ptr->type));
		break;
	}
	el_free(ptr);
}